

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  bool *pbVar1;
  char *text;
  uint i;
  uint d0;
  uint j;
  uint y;
  ulong uVar2;
  
  for (d0 = 0; d0 < (uint)*m; d0 = d0 + 1) {
    uVar2 = 0;
    while (y = (uint)uVar2, y < (uint)*n) {
      pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()(board,d0,uVar2);
      text = "X";
      if (*pbVar1 == false) {
        text = " ";
      }
      print_at(d0,y,text);
      uVar2 = (ulong)(y + 1);
    }
  }
  return;
}

Assistant:

void print_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			print_at(
				i,j,
				board(i,j) ? "X" : " "
			);
		}
}